

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int asciiToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  
  iVar5 = (int)in;
  iVar1 = *inlen;
  iVar6 = (int)out;
  iVar3 = iVar5;
  if (0 < (long)iVar1) {
    iVar6 = *outlen;
    lVar4 = 0;
    do {
      puVar7 = out + lVar4;
      if (((long)*outlen <= lVar4 + 5) || (out + iVar6 <= puVar7)) goto LAB_00143f92;
      if ((char)in[lVar4] < '\0') {
        *outlen = (int)lVar4;
        *inlen = (int)lVar4;
        return -1;
      }
      *puVar7 = in[lVar4];
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (in + lVar2 < in + iVar1);
    puVar7 = out + lVar4;
LAB_00143f92:
    iVar6 = (int)puVar7;
    iVar3 = (int)lVar4 + iVar5;
  }
  *outlen = iVar6 - (int)out;
  *inlen = iVar3 - iVar5;
  return *outlen;
}

Assistant:

static int
asciiToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    const unsigned char* processed = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    unsigned int c;

    inend = in + (*inlen);
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
	c= *in++;

        if (out >= outend)
	    break;
        if (c < 0x80) {
	    *out++ = c;
	} else {
	    *outlen = out - outstart;
	    *inlen = processed - base;
	    return(-1);
	}

	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlen = processed - base;
    return(*outlen);
}